

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall
btSoftBody::appendLinearJoint(btSoftBody *this,Specs *specs,Cluster *body0,Body body1)

{
  undefined8 uVar1;
  btVector3 *x;
  Cluster *in_RDX;
  btScalar *in_RSI;
  Body *in_RDI;
  btVector3 bVar2;
  LJoint *pj;
  undefined8 in_stack_fffffffffffffef8;
  btTransform *this_00;
  Joint **_Val;
  btAlignedObjectArray<btSoftBody::Joint_*> *this_01;
  LJoint *in_stack_ffffffffffffff20;
  btAlignedObjectArray<btSoftBody::Joint_*> local_d8 [2];
  btTransform *in_stack_ffffffffffffff68;
  Joint *local_88 [8];
  undefined8 local_48;
  undefined8 uStack_40;
  Body local_38;
  btVector3 *local_20;
  Cluster *local_18;
  btScalar *local_10;
  
  this_00 = (btTransform *)&stack0x00000008;
  local_18 = in_RDX;
  local_10 = in_RSI;
  x = (btVector3 *)
      btAlignedAllocInternal((size_t)this_00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  x[0xc].m_floats[0] = 0.0;
  x[0xc].m_floats[1] = 0.0;
  x[0xc].m_floats[2] = 0.0;
  x[0xc].m_floats[3] = 0.0;
  x[0xb].m_floats[0] = 0.0;
  x[0xb].m_floats[1] = 0.0;
  x[0xb].m_floats[2] = 0.0;
  x[0xb].m_floats[3] = 0.0;
  x[10].m_floats[0] = 0.0;
  x[10].m_floats[1] = 0.0;
  x[10].m_floats[2] = 0.0;
  x[10].m_floats[3] = 0.0;
  x[9].m_floats[0] = 0.0;
  x[9].m_floats[1] = 0.0;
  x[9].m_floats[2] = 0.0;
  x[9].m_floats[3] = 0.0;
  x[8].m_floats[0] = 0.0;
  x[8].m_floats[1] = 0.0;
  x[8].m_floats[2] = 0.0;
  x[8].m_floats[3] = 0.0;
  x[7].m_floats[0] = 0.0;
  x[7].m_floats[1] = 0.0;
  x[7].m_floats[2] = 0.0;
  x[7].m_floats[3] = 0.0;
  x[6].m_floats[0] = 0.0;
  x[6].m_floats[1] = 0.0;
  x[6].m_floats[2] = 0.0;
  x[6].m_floats[3] = 0.0;
  x[5].m_floats[0] = 0.0;
  x[5].m_floats[1] = 0.0;
  x[5].m_floats[2] = 0.0;
  x[5].m_floats[3] = 0.0;
  x[4].m_floats[0] = 0.0;
  x[4].m_floats[1] = 0.0;
  x[4].m_floats[2] = 0.0;
  x[4].m_floats[3] = 0.0;
  x[3].m_floats[0] = 0.0;
  x[3].m_floats[1] = 0.0;
  x[3].m_floats[2] = 0.0;
  x[3].m_floats[3] = 0.0;
  x[2].m_floats[0] = 0.0;
  x[2].m_floats[1] = 0.0;
  x[2].m_floats[2] = 0.0;
  x[2].m_floats[3] = 0.0;
  x[1].m_floats[0] = 0.0;
  x[1].m_floats[1] = 0.0;
  x[1].m_floats[2] = 0.0;
  x[1].m_floats[3] = 0.0;
  x->m_floats[0] = 0.0;
  x->m_floats[1] = 0.0;
  x->m_floats[2] = 0.0;
  x->m_floats[3] = 0.0;
  x[0xd].m_floats[0] = 0.0;
  x[0xd].m_floats[1] = 0.0;
  LJoint::LJoint(in_stack_ffffffffffffff20);
  local_20 = x;
  Body::Body(&local_38,local_18);
  *(btCollisionObject **)(local_20[1].m_floats + 2) = local_38.m_collisionObject;
  *(Cluster **)(local_20->m_floats + 2) = local_38.m_soft;
  *(btRigidBody **)local_20[1].m_floats = local_38.m_rigid;
  *(undefined8 *)local_20[3].m_floats = *(undefined8 *)(this_00->m_basis).m_el[1].m_floats;
  uVar1 = *(undefined8 *)((this_00->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)local_20[2].m_floats = *(undefined8 *)(this_00->m_basis).m_el[0].m_floats;
  *(undefined8 *)(local_20[2].m_floats + 2) = uVar1;
  Body::xform(in_RDI);
  _Val = local_88;
  btTransform::inverse(in_stack_ffffffffffffff68);
  bVar2 = btTransform::operator*(this_00,x);
  uStack_40 = bVar2.m_floats._8_8_;
  local_48 = bVar2.m_floats._0_8_;
  *(undefined8 *)(local_20[3].m_floats + 2) = local_48;
  *(undefined8 *)local_20[4].m_floats = uStack_40;
  Body::xform(in_RDI);
  this_01 = local_d8;
  btTransform::inverse(in_stack_ffffffffffffff68);
  bVar2 = btTransform::operator*(this_00,x);
  *(long *)(local_20[4].m_floats + 2) = bVar2.m_floats._0_8_;
  *(long *)local_20[5].m_floats = bVar2.m_floats._8_8_;
  local_20[5].m_floats[2] = local_10[1];
  local_20[5].m_floats[3] = *local_10;
  local_20[6].m_floats[0] = local_10[2];
  btAlignedObjectArray<btSoftBody::Joint_*>::push_back(this_01,_Val);
  return;
}

Assistant:

void			btSoftBody::appendLinearJoint(const LJoint::Specs& specs,Cluster* body0,Body body1)
{
	LJoint*		pj	=	new(btAlignedAlloc(sizeof(LJoint),16)) LJoint();
	pj->m_bodies[0]	=	body0;
	pj->m_bodies[1]	=	body1;
	pj->m_refs[0]	=	pj->m_bodies[0].xform().inverse()*specs.position;
	pj->m_refs[1]	=	pj->m_bodies[1].xform().inverse()*specs.position;
	pj->m_cfm		=	specs.cfm;
	pj->m_erp		=	specs.erp;
	pj->m_split		=	specs.split;
	m_joints.push_back(pj);
}